

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_last_block(cf_poly1305 *ctx)

{
  ulong local_60;
  size_t i;
  uint32_t c [17];
  cf_poly1305 *ctx_local;
  
  unique0x100000db = ctx;
  memset(&i,0,0x44);
  for (local_60 = 0; local_60 < stack0xfffffffffffffff0->npartial; local_60 = local_60 + 1) {
    c[local_60 - 2] = (uint)stack0xfffffffffffffff0->partial[local_60];
  }
  c[stack0xfffffffffffffff0->npartial - 2] = 1;
  poly1305_block(stack0xfffffffffffffff0,(uint32_t *)&i);
  return;
}

Assistant:

static void poly1305_last_block(cf_poly1305 *ctx)
{
  uint32_t c[17] = { 0 };
  size_t i;

  for (i = 0; i < ctx->npartial; i++)
    c[i] = ctx->partial[i];

  c[ctx->npartial] = 1;
  poly1305_block(ctx, c);
}